

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_report_handler.cpp
# Opt level: O0

void sc_core::sc_report_handler::cache_report(sc_report *rep)

{
  sc_process_b *this;
  long *plVar1;
  sc_report *in_stack_00000018;
  sc_report *in_stack_00000020;
  sc_process_b *proc;
  sc_report *in_stack_ffffffffffffffc8;
  
  this = sc_get_current_process_b();
  if (this == (sc_process_b *)0x0) {
    if (last_global_report != (long *)0x0) {
      (**(code **)(*last_global_report + 8))();
    }
    plVar1 = (long *)operator_new(0x50);
    sc_report::sc_report(in_stack_00000020,in_stack_00000018);
    last_global_report = plVar1;
  }
  else {
    operator_new(0x50);
    sc_report::sc_report(in_stack_00000020,in_stack_00000018);
    sc_process_b::set_last_report(this,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

void sc_report_handler::cache_report(const sc_report& rep)
{
    sc_process_b * proc = sc_get_current_process_b();
    if ( proc )
	proc->set_last_report(new sc_report(rep));
    else
    {
	delete last_global_report;
	last_global_report = new sc_report(rep);
    }
}